

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O0

Version * ZXing::QRCode::Version::Model1(int number)

{
  int iVar1;
  int in_EDI;
  array<ZXing::QRCode::ECBlocks,_4UL> *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  int versionNumber;
  Version *in_stack_fffffffffffffba0;
  Version *local_8;
  
  versionNumber = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  if (Model1(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Model1(int)::allVersions);
    if (iVar1 != 0) {
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version(in_stack_fffffffffffffba0,versionNumber,in_stack_fffffffffffffb90);
      Version((Version *)0x50000003c,0,(array<ZXing::QRCode::ECBlocks,_4UL> *)0x5c00000004);
      __cxa_atexit(__cxx_global_array_dtor_112,0,&__dso_handle);
      __cxa_guard_release(&Model1(int)::allVersions);
    }
  }
  if ((in_EDI < 1) || (0xe < in_EDI)) {
    local_8 = (Version *)0x0;
  }
  else {
    local_8 = (Version *)
              &rMQR::allVersions[(long)in_EDI + 0x1f]._alignmentPatternCenters.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  }
  return local_8;
}

Assistant:

const Version* Version::Model1(int number)
{
	/**
	 * See ISO 18004:2000 M.4.2 Table M.2
	 * See ISO 18004:2000 M.5 Table M.4
	 */
	static const Version allVersions[] = {
		{1, {
			7 , 1, 19, 0, 0,
			10, 1, 16, 0, 0,
			13, 1, 13, 0, 0,
			17, 1, 9 , 0, 0
			}},
		{2, {
			10, 1, 36, 0, 0,
			16, 1, 30, 0, 0,
			22, 1, 24, 0, 0,
			30, 1, 16, 0, 0,
			}},
		{3, {
			15, 1, 57, 0, 0,
			28, 1, 44, 0, 0,
			36, 1, 36, 0, 0,
			48, 1, 24, 0, 0,
			}},
		{4, {
			20, 1, 80, 0, 0,
			40, 1, 60, 0, 0,
			50, 1, 50, 0, 0,
			66, 1, 34, 0, 0,
			}},
		{5, {
			26, 1, 108, 0, 0,
			52, 1, 82 , 0, 0,
			66, 1, 68 , 0, 0,
			44, 2, 23 , 0, 0,
			}},
		{6, {
			34, 1, 136, 0, 0,
			32, 2, 53 , 0, 0,
			42, 2, 43 , 0, 0,
			56, 2, 29 , 0, 0,
			}},
		{7, {
			42, 1, 170, 0, 0,
			40, 2, 66 , 0, 0,
			52, 2, 54 , 0, 0,
			46, 3, 24 , 0, 0,
			}},
		{8, {
			24, 2, 104, 0, 0,
			48, 2, 80 , 0, 0,
			64, 2, 64 , 0, 0,
			56, 3, 29 , 0, 0,
			}},
		{9, {
			30, 2, 123, 0, 0,
			60, 2, 93 , 0, 0,
			50, 3, 52 , 0, 0,
			68, 3, 34 , 0, 0,
			}},
		{10, {
			34, 2, 145, 0, 0,
			68, 2, 111, 0, 0,
			58, 3, 61 , 0, 0,
			58, 4, 31 , 0, 0,
			}},
		{11, {
			40, 2, 168, 0, 0,
			40, 4, 64 , 0, 0,
			52, 4, 52 , 0, 0,
			54, 5, 29 , 0, 0,
			}},
		{12, {
			46, 2, 192, 0, 0,
			46, 4, 73 , 0, 0,
			58, 4, 61 , 0, 0,
			62, 5, 33 , 0, 0,
			}},
		{13, {
			36, 3, 144, 0, 0,
			52, 4, 83 , 0, 0,
			66, 4, 69 , 0, 0,
			58, 6, 32 , 0, 0,
			}},
		{14, {
			40, 3, 163, 0, 0,
			60, 4, 92 , 0, 0,
			60, 5, 62 , 0, 0,
			66, 6, 35 , 0, 0,
			}},
	};

	if (number < 1 || number > 14)
		return nullptr;
	return allVersions + number - 1;
}